

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::StrPair::CollapseWhitespace(StrPair *this)

{
  bool bVar1;
  char *pcVar2;
  long in_RDI;
  char *q;
  char *p;
  char *local_18;
  char *local_10;
  
  pcVar2 = XMLUtil::SkipWhiteSpace((char *)0x2a10cc);
  *(char **)(in_RDI + 8) = pcVar2;
  if (**(char **)(in_RDI + 8) != '\0') {
    local_18 = *(char **)(in_RDI + 8);
    for (local_10 = *(char **)(in_RDI + 8); *local_10 != '\0'; local_10 = local_10 + 1) {
      bVar1 = XMLUtil::IsWhiteSpace('\0');
      if (bVar1) {
        local_10 = XMLUtil::SkipWhiteSpace((char *)0x2a1123);
        if (*local_10 == '\0') break;
        *local_18 = ' ';
        local_18 = local_18 + 1;
      }
      *local_18 = *local_10;
      local_18 = local_18 + 1;
    }
    *local_18 = '\0';
  }
  return;
}

Assistant:

void StrPair::CollapseWhitespace()
{
    // Adjusting _start would cause undefined behavior on delete[]
    TIXMLASSERT( ( _flags & NEEDS_DELETE ) == 0 );
    // Trim leading space.
    _start = XMLUtil::SkipWhiteSpace( _start );

    if ( *_start ) {
        char* p = _start;	// the read pointer
        char* q = _start;	// the write pointer

        while( *p ) {
            if ( XMLUtil::IsWhiteSpace( *p )) {
                p = XMLUtil::SkipWhiteSpace( p );
                if ( *p == 0 ) {
                    break;    // don't write to q; this trims the trailing space.
                }
                *q = ' ';
                ++q;
            }
            *q = *p;
            ++q;
            ++p;
        }
        *q = 0;
    }
}